

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

char * CVmObjBigNum::cache_ln2(size_t prec)

{
  ulong prec_00;
  char *pcVar1;
  size_t sVar2;
  long in_RDI;
  int expanded;
  char *ext;
  char *in_stack_00000150;
  char *in_stack_00000158;
  CVmBigNumCache *siz;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  
  prec_00 = in_RDI + 7U & 0xfffffffffffffff8;
  siz = S_bignum_cache;
  calc_alloc(prec_00);
  pcVar1 = CVmBigNumCache::get_ln2_reg
                     ((CVmBigNumCache *)
                      CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),(size_t)siz,
                      (int *)0x30ad14);
  if (pcVar1 != (char *)0x0) {
    if ((in_stack_ffffffffffffffe4 != 0) || (sVar2 = get_prec((char *)0x30ad3c), sVar2 < prec_00)) {
      set_prec((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),(size_t)siz);
      compute_ln_into(in_stack_00000158,in_stack_00000150);
    }
    return pcVar1;
  }
  err_throw(0);
}

Assistant:

const char *CVmObjBigNum::cache_ln2(size_t prec)
{
    char *ext;
    int expanded;
    static const unsigned char two[] = { 0x01, 0x00, 0x01, 0x00, 0x00, 0x20 };

    /* round up the precision to minimize recalculations */
    prec = (prec + 7) & ~7;

    /* get the ln2 cache register */
    ext = S_bignum_cache->get_ln2_reg(calc_alloc(prec), &expanded);
    if (ext == 0)
        err_throw(VMERR_OUT_OF_MEMORY);

    /* if we had a cached value with enough precision, return it */
    if (!expanded && get_prec(ext) >= prec)
        return ext;

    /* reallocated - set the new precision and recalculate ln2 */
    set_prec(ext, prec);
    compute_ln_into(ext, (const char *)two);

    /* return the register pointer */
    return ext;
}